

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Buf.h
# Opt level: O0

void __thiscall
axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move
          (BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *this,
          BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *src)

{
  RefCount *in_RSI;
  undefined8 *in_RDI;
  
  if (in_RDI[1] != 0) {
    RefCount::release(in_RSI);
  }
  *in_RDI = in_RSI->_vptr_RefCount;
  in_RDI[1] = in_RSI->m_freeFunc;
  in_RDI[2] = *(undefined8 *)&in_RSI->m_refCount;
  initialize((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)in_RSI);
  return;
}

Assistant:

void
	move(BufRef&& src) {
		if (m_hdr)
			m_hdr->release();

		m_p = src.m_p;
		m_hdr = src.m_hdr;
		m_size = src.m_size;
		src.initialize();
	}